

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall AnalogConsumer::initialize(AnalogConsumer *this)

{
  pointer *ppuVar1;
  int iVar2;
  pointer piVar3;
  iterator __position;
  iterator __position_00;
  uchar uVar4;
  ulong in_RAX;
  pointer piVar5;
  pointer piVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  piVar6 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->il_byte_loc = *piVar6;
  piVar5 = piVar6 + 1;
  uStack_38 = in_RAX;
  if (piVar5 != piVar3) {
    memmove(piVar6,piVar5,(long)piVar3 - (long)piVar5);
  }
  piVar5 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = piVar6;
  if (piVar6 != piVar5) {
    uVar7 = 0;
    do {
      iVar2 = piVar5[uVar7 + 1];
      if (iVar2 != -1) {
        if (this->il_byte_loc < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "AnalogConsumer error: User requested interleaved data but id byte location not set\n"
                     ,0x53);
          this->il_byte_loc = 0;
        }
        uVar4 = (uchar)(1 << ((byte)iVar2 & 0x1f));
        uStack_38._0_6_ = CONCAT15(uVar4,(undefined5)uStack_38);
        __position._M_current =
             (this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->il_id_masks,
                     __position,(uchar *)((long)&uStack_38 + 5));
        }
        else {
          *__position._M_current = uVar4;
          ppuVar1 = &(this->il_id_masks).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uStack_38 = uStack_38 & 0xffffffffffff;
        __position_00._M_current =
             (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (&this->prev_interleaved,__position_00,(short *)((long)&uStack_38 + 6));
        }
        else {
          *__position_00._M_current = 0;
          (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      uVar7 = uVar7 + 2;
      piVar5 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->args).indices.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  return;
}

Assistant:

void AnalogConsumer::initialize(){
    //Get interleaved byte location
    il_byte_loc = args.indices.front();
    args.indices.erase(args.indices.begin());

    //Create masks for recognizing which interleaved data user wants
    for(size_t i = 0; i < args.indices.size(); i+=2){
//        int byte = args.indices[i];
        int bit = args.indices[i+1];
        if(bit == -1) continue; //Ignore everything if not interleaved
        if(il_byte_loc < 0){
            //if il byte location is not set, but user wants il data
            std::cerr << "AnalogConsumer error: User requested interleaved data but id byte location not set\n";
            il_byte_loc = 0; // TODO: let user handle error
        }
        uint8_t m = 0;
        m |= 1 << bit; //set the id bit
        il_id_masks.push_back(m);
        prev_interleaved.push_back(0); //set prev interleaved value
    }
    HFSubConsumer::initialize();
}